

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

bool checkInterfaceDirs(string *prepro,cmGeneratorTarget *target,string *prop)

{
  cmMakefile *this;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  PolicyStatus PVar6;
  char *pcVar7;
  cmLocalGenerator *pcVar8;
  pointer __s1;
  reference pbVar9;
  size_type sVar10;
  ostream *poVar11;
  string *psVar12;
  PolicyID id;
  PolicyID id_00;
  pointer local_568;
  bool local_502;
  bool local_501;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  undefined1 local_3f8 [8];
  ostringstream s;
  bool local_27b;
  undefined1 local_278 [5];
  bool shouldContinue;
  bool inSource;
  bool inBinary;
  char *local_258;
  undefined4 local_24c;
  string local_248;
  undefined1 local_228 [8];
  ostringstream e;
  MessageType local_ac;
  MessageType messageType;
  size_t genexPos;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  iterator li;
  undefined1 local_88 [6];
  bool hadFatalError;
  bool inSourceBuild;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  char *topBinaryDir;
  char *topSourceDir;
  allocator local_49;
  string local_48;
  char *local_28;
  char *installDir;
  string *prop_local;
  cmGeneratorTarget *target_local;
  string *prepro_local;
  
  this = target->Makefile;
  installDir = (char *)prop;
  prop_local = (string *)target;
  target_local = (cmGeneratorTarget *)prepro;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"CMAKE_INSTALL_PREFIX",&local_49);
  pcVar7 = cmMakefile::GetSafeDefinition(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_28 = pcVar7;
  pcVar8 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)prop_local);
  __s1 = (pointer)cmLocalGenerator::GetSourceDirectory(pcVar8);
  pcVar8 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)prop_local);
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)cmLocalGenerator::GetBinaryDirectory(pcVar8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_88);
  cmGeneratorExpression::Split
            ((string *)target_local,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_88);
  iVar5 = strcmp((char *)__s1,
                 (char *)parts.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  li._M_current._7_1_ = iVar5 == 0;
  li._M_current._6_1_ = 0;
  local_98._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_88);
  do {
    genexPos = (size_t)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_88);
    bVar1 = __gnu_cxx::operator!=
                      (&local_98,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&genexPos);
    if (!bVar1) {
      bVar4 = li._M_current._6_1_ ^ 0xff;
      local_24c = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88);
      return (bool)(bVar4 & 1);
    }
    pbVar9 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_98);
    sVar10 = cmGeneratorExpression::Find(pbVar9);
    if (sVar10 != 0) {
      local_ac = FATAL_ERROR;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
      if (sVar10 == 0xffffffffffffffff) {
LAB_0064d588:
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_98);
        local_258 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmHasLiteralPrefix<char_const*,18ul>(&local_258,(char (*) [18])0x90f72c);
        if (bVar1) {
          local_24c = 4;
        }
        else {
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_98);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar7);
          if (!bVar1) {
            poVar11 = std::operator<<((ostream *)local_228,"Target \"");
            psVar12 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)prop_local);
            poVar11 = std::operator<<(poVar11,(string *)psVar12);
            poVar11 = std::operator<<(poVar11,"\" ");
            poVar11 = std::operator<<(poVar11,(string *)installDir);
            poVar11 = std::operator<<(poVar11," property contains relative path:\n  \"");
            pbVar9 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_98);
            poVar11 = std::operator<<(poVar11,(string *)pbVar9);
            std::operator<<(poVar11,"\"");
            pcVar8 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)prop_local);
            std::__cxx11::ostringstream::str();
            cmLocalGenerator::IssueMessage(pcVar8,local_ac,(string *)local_278);
            std::__cxx11::string::~string((string *)local_278);
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_98);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          bVar1 = isSubDirectory(pcVar7,(char *)parts.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_98);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          bVar2 = isSubDirectory(pcVar7,(char *)__s1);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_98);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          bVar3 = isSubDirectory(pcVar7,local_28);
          if (bVar3) {
            if (bVar1) {
              bVar3 = isSubDirectory(local_28,(char *)parts.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                    );
              local_501 = false;
              if (bVar3) goto LAB_0064d830;
            }
            else {
LAB_0064d830:
              local_502 = true;
              if (bVar2) {
                local_502 = isSubDirectory(local_28,(char *)__s1);
              }
              local_501 = local_502;
            }
            local_27b = local_501;
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)installDir,"INTERFACE_INCLUDE_DIRECTORIES");
            if ((bVar3) && (local_501 == false)) {
              PVar6 = cmGeneratorTarget::GetPolicyStatusCMP0052((cmGeneratorTarget *)prop_local);
              if (PVar6 != OLD) {
                if (PVar6 != WARN) goto LAB_0064dba0;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_418,(cmPolicies *)0x34,id_00);
                poVar11 = std::operator<<((ostream *)local_3f8,(string *)&local_418);
                std::operator<<(poVar11,"\n");
                std::__cxx11::string::~string((string *)&local_418);
                poVar11 = std::operator<<((ostream *)local_3f8,"Directory:\n    \"");
                pbVar9 = __gnu_cxx::
                         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_98);
                poVar11 = std::operator<<(poVar11,(string *)pbVar9);
                poVar11 = std::operator<<(poVar11,
                                          "\"\nin INTERFACE_INCLUDE_DIRECTORIES of target \"");
                psVar12 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)prop_local);
                poVar11 = std::operator<<(poVar11,(string *)psVar12);
                poVar11 = std::operator<<(poVar11,
                                          "\" is a subdirectory of the install directory:\n    \"");
                poVar11 = std::operator<<(poVar11,local_28);
                poVar11 = std::operator<<(poVar11,"\"\nhowever it is also a subdirectory of the ");
                pcVar7 = "source";
                if (bVar1) {
                  pcVar7 = "build";
                }
                poVar11 = std::operator<<(poVar11,pcVar7);
                poVar11 = std::operator<<(poVar11," tree:\n    \"");
                local_568 = __s1;
                if (bVar1) {
                  local_568 = parts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                }
                poVar11 = std::operator<<(poVar11,(char *)local_568);
                poVar11 = std::operator<<(poVar11,"\"");
                std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                pcVar8 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)prop_local);
                std::__cxx11::ostringstream::str();
                cmLocalGenerator::IssueMessage(pcVar8,AUTHOR_WARNING,&local_438);
                std::__cxx11::string::~string((string *)&local_438);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f8);
              }
              local_27b = true;
            }
LAB_0064dba0:
            if (local_27b != false) {
              local_24c = 4;
              goto LAB_0064de84;
            }
          }
          if (bVar1) {
            poVar11 = std::operator<<((ostream *)local_228,"Target \"");
            psVar12 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)prop_local);
            poVar11 = std::operator<<(poVar11,(string *)psVar12);
            poVar11 = std::operator<<(poVar11,"\" ");
            poVar11 = std::operator<<(poVar11,(string *)installDir);
            poVar11 = std::operator<<(poVar11," property contains path:\n  \"");
            pbVar9 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_98);
            poVar11 = std::operator<<(poVar11,(string *)pbVar9);
            std::operator<<(poVar11,"\"\nwhich is prefixed in the build directory.");
            pcVar8 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)prop_local);
            std::__cxx11::ostringstream::str();
            cmLocalGenerator::IssueMessage(pcVar8,local_ac,&local_458);
            std::__cxx11::string::~string((string *)&local_458);
          }
          if (((li._M_current._7_1_ & 1) == 0) && (bVar2)) {
            poVar11 = std::operator<<((ostream *)local_228,"Target \"");
            psVar12 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)prop_local);
            poVar11 = std::operator<<(poVar11,(string *)psVar12);
            poVar11 = std::operator<<(poVar11,"\" ");
            poVar11 = std::operator<<(poVar11,(string *)installDir);
            poVar11 = std::operator<<(poVar11," property contains path:\n  \"");
            pbVar9 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_98);
            poVar11 = std::operator<<(poVar11,(string *)pbVar9);
            std::operator<<(poVar11,"\"\nwhich is prefixed in the source directory.");
            pcVar8 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)prop_local);
            std::__cxx11::ostringstream::str();
            cmLocalGenerator::IssueMessage(pcVar8,local_ac,&local_478);
            std::__cxx11::string::~string((string *)&local_478);
          }
          local_24c = 0;
        }
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )installDir,"INTERFACE_INCLUDE_DIRECTORIES");
        if (!bVar1) {
          li._M_current._6_1_ = 1;
          goto LAB_0064d588;
        }
        PVar6 = cmGeneratorTarget::GetPolicyStatusCMP0041((cmGeneratorTarget *)prop_local);
        if (PVar6 != OLD) {
          if (PVar6 == WARN) {
            local_ac = WARNING;
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_248,(cmPolicies *)0x29,id);
            poVar11 = std::operator<<((ostream *)local_228,(string *)&local_248);
            std::operator<<(poVar11,"\n");
            std::__cxx11::string::~string((string *)&local_248);
          }
          else if (PVar6 - NEW < 3) {
            li._M_current._6_1_ = 1;
          }
          goto LAB_0064d588;
        }
        local_24c = 4;
      }
LAB_0064de84:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_98);
  } while( true );
}

Assistant:

static bool checkInterfaceDirs(const std::string &prepro,
                      cmGeneratorTarget *target, const std::string& prop)
{
  const char* installDir =
            target->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
  const char* topSourceDir =
      target->GetLocalGenerator()->GetSourceDirectory();
  const char* topBinaryDir =
      target->GetLocalGenerator()->GetBinaryDirectory();

  std::vector<std::string> parts;
  cmGeneratorExpression::Split(prepro, parts);

  const bool inSourceBuild = strcmp(topSourceDir, topBinaryDir) == 0;

  bool hadFatalError = false;

  for(std::vector<std::string>::iterator li = parts.begin();
      li != parts.end(); ++li)
    {
    size_t genexPos = cmGeneratorExpression::Find(*li);
    if (genexPos == 0)
      {
      continue;
      }
    cmake::MessageType messageType = cmake::FATAL_ERROR;
    std::ostringstream e;
    if (genexPos != std::string::npos)
      {
      if (prop == "INTERFACE_INCLUDE_DIRECTORIES")
        {
        switch (target->GetPolicyStatusCMP0041())
          {
          case cmPolicies::WARN:
            messageType = cmake::WARNING;
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0041) << "\n";
            break;
          case cmPolicies::OLD:
            continue;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            hadFatalError = true;
            break; // Issue fatal message.
          }
        }
      else
        {
        hadFatalError = true;
        }
      }
    if (cmHasLiteralPrefix(li->c_str(), "${_IMPORT_PREFIX}"))
      {
      continue;
      }
    if (!cmSystemTools::FileIsFullPath(li->c_str()))
      {
      e << "Target \"" << target->GetName() << "\" " << prop <<
           " property contains relative path:\n"
           "  \"" << *li << "\"";
      target->GetLocalGenerator()->IssueMessage(messageType, e.str());
      }
    bool inBinary = isSubDirectory(li->c_str(), topBinaryDir);
    bool inSource = isSubDirectory(li->c_str(), topSourceDir);
    if (isSubDirectory(li->c_str(), installDir))
      {
      // The include directory is inside the install tree.  If the
      // install tree is not inside the source tree or build tree then
      // fall through to the checks below that the include directory is not
      // also inside the source tree or build tree.
      bool shouldContinue =
        (!inBinary || isSubDirectory(installDir, topBinaryDir)) &&
        (!inSource || isSubDirectory(installDir, topSourceDir));

      if (prop == "INTERFACE_INCLUDE_DIRECTORIES")
        {
        if (!shouldContinue)
          {
          switch(target->GetPolicyStatusCMP0052())
            {
            case cmPolicies::WARN:
              {
              std::ostringstream s;
              s << cmPolicies::GetPolicyWarning(cmPolicies::CMP0052) << "\n";
              s << "Directory:\n    \"" << *li << "\"\nin "
                "INTERFACE_INCLUDE_DIRECTORIES of target \""
                << target->GetName() << "\" is a subdirectory of the install "
                "directory:\n    \"" << installDir << "\"\nhowever it is also "
                "a subdirectory of the " << (inBinary ? "build" : "source")
                << " tree:\n    \"" << (inBinary ? topBinaryDir : topSourceDir)
                << "\"" << std::endl;
              target->GetLocalGenerator()->IssueMessage(cmake::AUTHOR_WARNING,
                                                  s.str());
              }
            case cmPolicies::OLD:
              shouldContinue = true;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
            }
          }
        }
      if (shouldContinue)
        {
        continue;
        }
      }
    if (inBinary)
      {
      e << "Target \"" << target->GetName() << "\" " << prop <<
           " property contains path:\n"
           "  \"" << *li << "\"\nwhich is prefixed in the build directory.";
      target->GetLocalGenerator()->IssueMessage(messageType, e.str());
      }
    if (!inSourceBuild)
      {
      if (inSource)
        {
        e << "Target \"" << target->GetName() << "\" " << prop <<
            " property contains path:\n"
            "  \"" << *li << "\"\nwhich is prefixed in the source directory.";
        target->GetLocalGenerator()->IssueMessage(messageType, e.str());
        }
      }
    }
  return !hadFatalError;
}